

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcSweptDiskSolid,_5UL>::Construct
                   (DB *db,LIST *params)

{
  IfcSweptDiskSolid *in;
  
  in = (IfcSweptDiskSolid *)operator_new(0x88);
  *(undefined ***)&in->field_0x70 = &PTR__Object_008048a0;
  *(undefined8 *)&in->field_0x78 = 0;
  *(char **)&in->field_0x80 = "IfcSweptDiskSolid";
  Assimp::IFC::Schema_2x3::IfcSolidModel::IfcSolidModel
            ((IfcSolidModel *)in,&PTR_construction_vtable_24__0082f738);
  *(undefined8 *)&(in->super_IfcSolidModel).field_0x38 = 0;
  *(undefined8 *)&(in->super_IfcSolidModel).field_0x40 = 0;
  (in->super_IfcSolidModel).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcSweptDiskSolid_0082f680;
  *(undefined ***)&in->field_0x70 = &PTR__IfcSweptDiskSolid_0082f720;
  *(undefined ***)
   &(in->super_IfcSolidModel).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       &PTR__IfcSweptDiskSolid_0082f6a8;
  *(undefined ***)
   &(in->super_IfcSolidModel).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       &PTR__IfcSweptDiskSolid_0082f6d0;
  *(undefined ***)&(in->super_IfcSolidModel).super_IfcGeometricRepresentationItem.field_0x30 =
       &PTR__IfcSweptDiskSolid_0082f6f8;
  (in->InnerRadius).have = false;
  GenericFill<Assimp::IFC::Schema_2x3::IfcSweptDiskSolid>(db,params,in);
  return (Object *)
         ((long)&(in->super_IfcSolidModel).super_IfcGeometricRepresentationItem.
                 super_IfcRepresentationItem.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                 _vptr_ObjectHelper +
         (long)(in->super_IfcSolidModel).super_IfcGeometricRepresentationItem.
               super_IfcRepresentationItem.
               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
               _vptr_ObjectHelper[-3]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }